

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall PowerPos<0,_0,_0>::propagate_z(PowerPos<0,_0,_0> *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  IntVar *pIVar4;
  double dVar5;
  
  dVar5 = pow((double)(((this->x).var)->min).v,(double)(((this->y).var)->min).v);
  if (-500000000.0 < dVar5) {
    pIVar4 = (this->z).var;
    if ((long)(pIVar4->min).v < (long)dVar5) {
      if (so.lazy == true) {
        iVar1 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar3 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
        pIVar4 = (this->z).var;
      }
      else {
        uVar3 = 0;
      }
      iVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar4,(long)dVar5,uVar3,1);
      if ((char)iVar1 == '\0') {
        return false;
      }
    }
  }
  dVar5 = pow((double)(((this->x).var)->max).v,(double)(((this->y).var)->max).v);
  if (500000000.0 <= dVar5) {
    return true;
  }
  pIVar4 = (this->z).var;
  if ((long)dVar5 < (long)(pIVar4->max).v) {
    if (so.lazy == true) {
      iVar1 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar2 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar3 = (ulong)uVar2 << 0x20 | (long)iVar1 << 2 | 3;
      pIVar4 = (this->z).var;
    }
    else {
      uVar3 = 0;
    }
    iVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xf])(pIVar4,(long)dVar5,uVar3,1);
    if ((char)iVar1 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate_z() {
		// Propagation on the lower bound
		const double z_min_new = pow(x.getMin(), y.getMin());
		if (z_min_new > (double)IntVar::min_limit) {
			setDom(z, setMin, static_cast<int64_t>(z_min_new), x.getMinLit(), y.getMinLit());
		}
		// Propagation on the upper bound
		const double z_max_new = pow(x.getMax(), y.getMax());
		if (z_max_new < (double)IntVar::max_limit) {
			setDom(z, setMax, static_cast<int64_t>(z_max_new), x.getMaxLit(), y.getMaxLit());
		}
		return true;
	}